

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame2.c
# Opt level: O0

int qsort_compare(void *elem1,void *elem2)

{
  Dwarf_Addr addr2;
  Dwarf_Addr addr1;
  Dwarf_Fde_conflict fde2;
  Dwarf_Fde_conflict fde1;
  void *elem2_local;
  void *elem1_local;
  
  if (*(ulong *)(*elem1 + 0x20) < *(ulong *)(*elem2 + 0x20)) {
    elem1_local._4_4_ = -1;
  }
  else if (*(ulong *)(*elem2 + 0x20) < *(ulong *)(*elem1 + 0x20)) {
    elem1_local._4_4_ = 1;
  }
  else {
    elem1_local._4_4_ = 0;
  }
  return elem1_local._4_4_;
}

Assistant:

static int
qsort_compare(const void *elem1, const void *elem2)
{
    const Dwarf_Fde fde1 = *(const Dwarf_Fde *) elem1;
    const Dwarf_Fde fde2 = *(const Dwarf_Fde *) elem2;
    Dwarf_Addr addr1 = fde1->fd_initial_location;
    Dwarf_Addr addr2 = fde2->fd_initial_location;

    if (addr1 < addr2) {
        return -1;
    } else if (addr1 > addr2) {
        return 1;
    }
    return 0;
}